

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hh
# Opt level: O3

string * __thiscall
hgdb::json::JSONWriter::escape_abi_cxx11_
          (string *__return_storage_ptr__,JSONWriter *this,string_view value)

{
  ostream *poVar1;
  long lVar2;
  stringstream ss;
  char local_1b9;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  if (this != (JSONWriter *)0x0) {
    lVar2 = 0;
    do {
      local_1b9 = *(char *)(lVar2 + value._M_len);
      if (local_1b9 == '\\') {
        local_1b9 = '\\';
        poVar1 = std::__ostream_insert<char,std::char_traits<char>>(local_1a8,&local_1b9,1);
        local_1b9 = '\\';
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_1b9,1);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,&local_1b9,1);
      }
      lVar2 = lVar2 + 1;
    } while (this != (JSONWriter *)lVar2);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

static std::string escape(std::string_view value) {
        std::stringstream ss;
        for (auto c : value) {
            if (c == '\\') {
                ss << '\\' << '\\';
            } else {
                ss << c;
            }
        }

        return ss.str();
    }